

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int parse_all_expressions(SymbolTable *sym)

{
  BOOL BVar1;
  int iVar2;
  undefined1 local_80 [8];
  List dummy;
  List def;
  List *pLStack_18;
  int num_parsed;
  List *new;
  SymbolTable *sym_local;
  
  def.token.lineno._4_4_ = 0;
  while (BVar1 = fetch_next_token((Token *)&def.car), BVar1 != FALSE) {
    if ((int)def.car != 0x1e) {
      fatal_input_error("Expecting \'(\' but not finding one; aborting.\n");
    }
    pLStack_18 = parse_expression();
    if (pLStack_18 == (List *)0x0) {
      input_error("stray \'(\' with no following expression!");
    }
    else {
      if (((pLStack_18->token).type != TOK_DEFINE) && ((pLStack_18->token).type != TOK_DEFOPCODE)) {
        memset(local_80,0,0x30);
        dummy.token._0_8_ = (pLStack_18->token).u;
        dummy.token.u = (anon_union_8_7_0ba269be_for_u)(pLStack_18->token).filename;
        dummy.token.filename = (char *)(pLStack_18->token).lineno;
        dummy.car = (ListStruct *)
                    CONCAT44((int)((ulong)*(undefined8 *)&pLStack_18->token >> 0x20),0x4c);
        dummy.cdr = pLStack_18;
        reduce((List *)local_80,sym,0);
        pLStack_18 = dummy.cdr;
      }
      if (pLStack_18 != (List *)0x0) {
        if ((pLStack_18->token).type == TOK_DEFINE) {
          iVar2 = parse_define(sym,pLStack_18->cdr);
          def.token.lineno._4_4_ = iVar2 + def.token.lineno._4_4_;
        }
        else if ((pLStack_18->token).type == TOK_DEFOPCODE) {
          iVar2 = parse_defopcode(sym,pLStack_18->cdr);
          def.token.lineno._4_4_ = iVar2 + def.token.lineno._4_4_;
          if (preprocess_only != FALSE) {
            fputs("\n(",_stdout);
            print_list((FILE *)_stdout,pLStack_18);
            puts(")");
          }
        }
      }
    }
  }
  return def.token.lineno._4_4_;
}

Assistant:

int
parse_all_expressions (SymbolTable *sym)
{
  List *new;
  int num_parsed = 0;
  List def;

  while (fetch_next_token (&def.token))
    {
      if (def.token.type != TOK_LEFT_PAREN)
	fatal_input_error ("Expecting '(' but not finding one; aborting.\n");

      /* Read in the expression just defined. */
      new = parse_expression ();
      if (new == NULL)
	{
	  input_error ("stray '(' with no following expression!");
	  continue;
	}

      if (new->token.type != TOK_DEFINE && new->token.type != TOK_DEFOPCODE)
	{
	  List dummy = { NULL, 0 /* new */, { /* new->token */0 } };
	  dummy.car = new;
	  dummy.token = new->token;
	  dummy.token.type = TOK_LIST;
	  reduce (&dummy, sym, 0);
	  new = dummy.car;
	}

      if (new != NULL)
	{
	  if (new->token.type == TOK_DEFINE)
	    num_parsed += parse_define (sym, new->cdr);
	  else if (new->token.type == TOK_DEFOPCODE)
	    {
	      num_parsed += parse_defopcode (sym, new->cdr);

	      if (preprocess_only)
		{
		  fputs ("\n(", stdout);
		  print_list (stdout, new);
		  puts (")");
		}
	    }
	}
    }

  return num_parsed;
}